

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::flipinsertfacet
          (tetgenmesh *this,arraypool *crosstets,arraypool *toppoints,arraypool *botpoints,
          arraypool *midpoints)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  tetrahedron *pppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  tetrahedron ppdVar8;
  badface *pbVar9;
  memorypool *pmVar10;
  tetrahedron *pppdVar11;
  arraypool *paVar12;
  long lVar13;
  tetrahedron *pppdVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  arraypool *this_00;
  triface *unaff_R13;
  bool bVar20;
  double dVar21;
  triface *local_1f8;
  ulong local_1f0;
  arraypool *local_1e8;
  double local_1e0;
  arraypool *local_1d8;
  tetrahedron *local_1d0;
  arraypool *local_1c8;
  int local_1bc;
  tetrahedron *local_1b8;
  long local_1b0;
  tetrahedron local_1a8;
  tetrahedron local_1a0;
  tetrahedron local_198;
  badface *pqueue;
  triface local_188;
  triface local_178;
  tetrahedron *local_168;
  undefined4 local_160;
  tetrahedron *local_158;
  undefined4 local_150;
  ulong local_128;
  tetrahedron local_120;
  point plane_pa;
  tetrahedron *local_110;
  point local_108;
  long local_100;
  long local_f8;
  long local_f0;
  arraypool *local_e8;
  arraypool *local_e0;
  point plane_pc;
  point plane_pb;
  flipconstraints fc;
  double ori [3];
  
  lVar13 = 8;
  do {
    *(undefined8 *)((long)&pqueue + lVar13) = 0;
    *(undefined4 *)((long)&local_188.tet + lVar13) = 0;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x68);
  fc.seg[0] = (point)0x0;
  fc.fac[0] = (point)0x0;
  fc.remvert = (point)0x0;
  fc.enqflag = 0;
  fc.chkencflag = 0;
  fc.unflip = 0;
  fc.collectnewtets = 0;
  fc.collectencsegflag = 0;
  fc.remove_ndelaunay_edge = 0;
  fc.bak_tetprism_vol._0_4_ = 0;
  fc.bak_tetprism_vol._4_4_ = 0;
  fc.tetprism_vol_sum._0_4_ = 0;
  fc._36_8_ = 0;
  fc.checkflipeligibility = 0;
  fc.cosdihed_in = 0.0;
  fc.cosdihed_out = 0.0;
  local_100 = this->flip23count;
  local_f8 = this->flip32count;
  local_f0 = this->flip44count;
  calculateabovepoint(this,midpoints,&plane_pa,&plane_pb,&plane_pc);
  lVar15 = 0;
  lVar13 = toppoints->objects;
  if (toppoints->objects < 1) {
    lVar13 = lVar15;
  }
  for (; lVar13 != lVar15; lVar15 = lVar15 + 1) {
    uVar2 = *(uint *)(*(long *)(toppoints->toparray
                                [(uint)lVar15 >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                               (long)toppoints->objectbytes *
                               (long)(int)(toppoints->objectsperblockmark & (uint)lVar15)) + 4 +
                     (long)this->pointmarkindex * 4);
    if ((uVar2 & 2) == 0) {
      *(uint *)(*(long *)(toppoints->toparray
                          [(uint)lVar15 >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                         (long)toppoints->objectbytes *
                         (long)(int)(toppoints->objectsperblockmark & (uint)lVar15)) + 4 +
               (long)this->pointmarkindex * 4) = uVar2 | 4;
    }
  }
  lVar15 = 0;
  lVar13 = botpoints->objects;
  if (botpoints->objects < 1) {
    lVar13 = lVar15;
  }
  for (; lVar13 != lVar15; lVar15 = lVar15 + 1) {
    uVar2 = *(uint *)(*(long *)(botpoints->toparray
                                [(uint)lVar15 >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                               (long)botpoints->objectbytes *
                               (long)(int)(botpoints->objectsperblockmark & (uint)lVar15)) + 4 +
                     (long)this->pointmarkindex * 4);
    if ((uVar2 & 2) == 0) {
      *(uint *)(*(long *)(botpoints->toparray
                          [(uint)lVar15 >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                         (long)botpoints->objectbytes *
                         (long)(int)(botpoints->objectsperblockmark & (uint)lVar15)) + 4 +
               (long)this->pointmarkindex * 4) = uVar2 | 8;
    }
  }
  local_1e8 = this->cavetetlist;
  local_1c8 = crosstets;
  local_e8 = toppoints;
  local_e0 = botpoints;
  for (lVar13 = 0; paVar12 = local_1c8, this_00 = local_1e8, lVar15 = local_1c8->objects,
      lVar13 < lVar15; lVar13 = lVar13 + 1) {
    lVar15 = (long)local_1c8->objectbytes *
             (long)(int)(local_1c8->objectsperblockmark & (uint)lVar13);
    unaff_R13 = (triface *)
                (local_1c8->toparray[(uint)lVar13 >> ((byte)local_1c8->log2objectsperblock & 0x1f)]
                + lVar15);
    pppdVar4 = *(tetrahedron **)
                (local_1c8->toparray[(uint)lVar13 >> ((byte)local_1c8->log2objectsperblock & 0x1f)]
                + lVar15);
    local_1f8 = unaff_R13;
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      if ((*(uint *)(((ulong)pppdVar4[lVar15] & 0xfffffffffffffff0) +
                    (long)this->elemmarkerindex * 4) & 3) == 1) {
        arraypool::newindex(local_1e8,&local_1f8);
        local_1f8->tet = pppdVar4;
        local_1f8->ver = (int)lVar15;
        unaff_R13 = local_1f8;
      }
    }
    puVar1 = (uint *)((long)pppdVar4 + (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 | 2;
  }
  if (1 < this->b->verbose) {
    printf("    Found %ld crossing faces.\n",local_1e8->objects);
    lVar15 = paVar12->objects;
  }
  lVar13 = 0;
  if (lVar15 < 1) {
    lVar15 = lVar13;
  }
  for (; lVar15 != lVar13; lVar13 = lVar13 + 1) {
    lVar18 = (long)paVar12->objectbytes * (long)(int)(paVar12->objectsperblockmark & (uint)lVar13);
    unaff_R13 = (triface *)
                (paVar12->toparray[(uint)lVar13 >> ((byte)paVar12->log2objectsperblock & 0x1f)] +
                lVar18);
    lVar18 = *(long *)(paVar12->toparray
                       [(uint)lVar13 >> ((byte)paVar12->log2objectsperblock & 0x1f)] + lVar18);
    puVar1 = (uint *)(lVar18 + (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffd;
    puVar1 = (uint *)(lVar18 + (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  pqueue = (badface *)0x0;
  local_1c8 = (arraypool *)plane_pc;
  for (lVar13 = 0; lVar13 < this_00->objects; lVar13 = lVar13 + 1) {
    unaff_R13 = (triface *)
                (this_00->toparray[(uint)lVar13 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                (long)this_00->objectbytes *
                (long)(int)(this_00->objectsperblockmark & (uint)lVar13));
    flipcertify(this,unaff_R13,&pqueue,plane_pa,plane_pb,(point)local_1c8);
  }
  local_108 = plane_pb;
  this_00->objects = 0;
  local_1f8 = unaff_R13;
  paVar12 = (arraypool *)operator_new(0x30);
  paVar12->objectbytes = 0x10;
  paVar12->objectsperblock = 0x10;
  paVar12->log2objectsperblock = 4;
  paVar12->objectsperblockmark = 0xf;
  paVar12->toparraylen = 0;
  paVar12->totalmemory = 0;
  paVar12->toparray = (char **)0x0;
  paVar12->objects = 0;
  local_128 = 0;
LAB_0012baa2:
  do {
    do {
      if (pqueue == (badface *)0x0) {
        if ((int)local_128 == 0 && 0 < paVar12->objects) {
          printf("!! No flip is found in %ld faces.\n");
          terminatetetgen(this,2);
        }
        arraypool::~arraypool(paVar12);
        operator_delete(paVar12,0x30);
        lVar15 = 0;
        lVar13 = local_e8->objects;
        if (local_e8->objects < 1) {
          lVar13 = lVar15;
        }
        for (; lVar13 != lVar15; lVar15 = lVar15 + 1) {
          puVar1 = (uint *)(*(long *)(local_e8->toparray
                                      [(uint)lVar15 >> ((byte)local_e8->log2objectsperblock & 0x1f)]
                                     + (long)local_e8->objectbytes *
                                       (long)(int)(local_e8->objectsperblockmark & (uint)lVar15)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar1 = *puVar1 & 0xfffffffb;
        }
        lVar15 = 0;
        lVar13 = local_e0->objects;
        if (local_e0->objects < 1) {
          lVar13 = lVar15;
        }
        for (; lVar13 != lVar15; lVar15 = lVar15 + 1) {
          puVar1 = (uint *)(*(long *)(local_e0->toparray
                                      [(uint)lVar15 >> ((byte)local_e0->log2objectsperblock & 0x1f)]
                                     + (long)local_e0->objectbytes *
                                       (long)(int)(local_e0->objectsperblockmark & (uint)lVar15)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar1 = *puVar1 & 0xfffffff7;
        }
        if (2 < this->b->verbose) {
          printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
                 (this->flip32count - local_f8) + (this->flip23count - local_100) +
                 (this->flip44count - local_f0));
        }
        return;
      }
      pppdVar4 = (pqueue->tt).tet;
      uVar2 = (pqueue->tt).ver;
      dVar21 = pqueue->key;
      ppdVar5 = (tetrahedron)pqueue->forg;
      ppdVar6 = (tetrahedron)pqueue->fdest;
      ppdVar7 = (tetrahedron)pqueue->fapex;
      ppdVar8 = (tetrahedron)pqueue->foppo;
      local_1d0 = (tetrahedron *)pqueue->noppo;
      pbVar9 = pqueue->nextitem;
      pmVar10 = this->flippool;
      (pqueue->tt).tet = (tetrahedron *)pmVar10->deaditemstack;
      pmVar10->deaditemstack = pqueue;
      pmVar10->items = pmVar10->items + -1;
      pqueue = pbVar9;
    } while (((((pppdVar4 == (tetrahedron *)0x0) || (pppdVar4[4] == (tetrahedron)0x0)) ||
              (pppdVar4[orgpivot[(int)uVar2]] != ppdVar5)) ||
             ((pppdVar4[destpivot[(int)uVar2]] != ppdVar6 ||
              (pppdVar4[apexpivot[(int)uVar2]] != ppdVar7)))) ||
            (local_120 = pppdVar4[oppopivot[(int)uVar2]], pppdVar4[oppopivot[(int)uVar2]] != ppdVar8
            ));
    local_110 = (tetrahedron *)((ulong)pppdVar4[uVar2 & 3] & 0xfffffffffffffff0);
    lVar13 = (long)fsymtbl[(int)uVar2][(uint)pppdVar4[uVar2 & 3] & 0xf];
    pppdVar14 = (tetrahedron *)local_110[oppopivot[lVar13]];
  } while (pppdVar14 != local_1d0);
  uVar17 = (ulong)uVar2;
  local_1e0 = dVar21;
  local_1d8 = paVar12;
  local_1b8 = pppdVar14;
  local_1b0 = lVar13;
  local_1a8 = ppdVar8;
  local_1a0 = ppdVar7;
  local_198 = ppdVar6;
  if (2 < this->b->verbose) {
    lVar13 = (long)this->pointmarkindex;
    local_1f0 = (ulong)uVar2;
    printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",dVar21,
           (ulong)*(uint *)((long)ppdVar5 + lVar13 * 4),(ulong)*(uint *)((long)ppdVar6 + lVar13 * 4)
           ,(ulong)*(uint *)((long)ppdVar7 + lVar13 * 4),
           (ulong)*(uint *)((long)ppdVar8 + lVar13 * 4),
           (ulong)*(uint *)((long)local_1d0 + lVar13 * 4));
    uVar17 = local_1f0;
  }
  local_1bc = 0;
  local_1f0 = CONCAT44(local_1f0._4_4_,3);
  for (lVar13 = 0; paVar12 = local_1d8, iVar16 = (int)uVar17, lVar13 != 3; lVar13 = lVar13 + 1) {
    dVar21 = orient3d((double *)pppdVar4[orgpivot[iVar16]],(double *)pppdVar4[destpivot[iVar16]],
                      (double *)local_120,(double *)local_1b8);
    ori[lVar13] = dVar21;
    if (0.0 <= dVar21) {
      if ((dVar21 == 0.0) && (!NAN(dVar21))) {
        local_1f0 = CONCAT44(local_1f0._4_4_,(int)local_1f0 + -1);
        local_1bc = local_1bc + 1;
      }
    }
    else {
      local_1f0 = CONCAT44(local_1f0._4_4_,(int)local_1f0 + -1);
    }
    uVar17 = (ulong)(uint)enexttbl[iVar16];
    this_00 = local_1e8;
  }
  if ((int)local_1f0 == 3) {
    local_178.tet = local_110;
    local_178.ver = (int)local_1b0;
    local_188.tet = pppdVar4;
    local_188.ver = iVar16;
    flip23(this,&local_188,1,&fc);
    for (lVar13 = 8; lVar13 != 0x38; lVar13 = lVar13 + 0x10) {
      pppdVar4 = *(tetrahedron **)((long)&pqueue + lVar13);
      iVar16 = eprevesymtbl[*(int *)((long)&local_188.tet + lVar13)];
      arraypool::newindex(this_00,&local_1f8);
      local_1f8->tet = pppdVar4;
      local_1f8->ver = iVar16;
      unaff_R13 = local_1f8;
    }
    for (lVar13 = 8; lVar13 != 0x38; lVar13 = lVar13 + 0x10) {
      pppdVar4 = *(tetrahedron **)((long)&pqueue + lVar13);
      iVar16 = enextesymtbl[*(int *)((long)&local_188.tet + lVar13)];
      arraypool::newindex(this_00,&local_1f8);
      local_1f8->tet = pppdVar4;
      local_1f8->ver = iVar16;
      unaff_R13 = local_1f8;
    }
  }
  else {
    if ((int)local_1f0 != 2) {
      if (2 < this->b->verbose) {
        lVar13 = (long)this->pointmarkindex;
        printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",
               (ulong)*(uint *)((long)ppdVar5 + lVar13 * 4),
               (ulong)*(uint *)((long)local_198 + lVar13 * 4),
               (ulong)*(uint *)((long)local_1a0 + lVar13 * 4),
               (ulong)*(uint *)((long)local_1a8 + lVar13 * 4),
               (ulong)*(uint *)((long)local_1d0 + lVar13 * 4));
      }
      goto LAB_0012baa2;
    }
    for (lVar13 = 0; (lVar13 != 3 && (0.0 < ori[lVar13])); lVar13 = lVar13 + 1) {
      uVar17 = (ulong)(uint)enexttbl[(int)uVar17];
    }
    local_188.tet = pppdVar4;
    local_188.ver = esymtbl[(int)uVar17];
    uVar19 = 0;
    pppdVar14 = pppdVar4;
    lVar13 = 0;
    local_1f0 = uVar17;
    do {
      if ((*(byte *)((long)pppdVar14[apexpivot[*(int *)((long)&local_188.ver + lVar13)]] +
                    (long)this->pointmarkindex * 4 + 4) & 0xe) == 0) goto LAB_0012c2c4;
      fnext(this,(triface *)((long)&local_188.tet + lVar13),
            (triface *)((long)&local_178.tet + lVar13));
      pppdVar11 = local_158;
      lVar15 = lVar13 + 0x10;
      if (3 < uVar19) break;
      uVar19 = uVar19 + 1;
      pppdVar14 = *(tetrahedron **)((long)&(&local_188)[1].tet + lVar13);
      lVar13 = lVar15;
    } while (pppdVar14 != pppdVar4);
    if (lVar15 != 0x30) {
      if (local_1bc == 1 && lVar15 == 0x40) {
        local_188.ver = (int)local_1f0;
        local_1d0 = local_168;
        local_120 = (tetrahedron)CONCAT44(local_120._4_4_,local_160);
        local_1e0 = (double)CONCAT44(local_1e0._4_4_,local_150);
        local_188.tet = pppdVar4;
        flip23(this,&local_188,1,&fc);
        for (lVar13 = 0x18; lVar13 != 0x38; lVar13 = lVar13 + 0x10) {
          pppdVar4 = *(tetrahedron **)((long)&pqueue + lVar13);
          iVar16 = eprevesymtbl[*(int *)((long)&local_188.tet + lVar13)];
          arraypool::newindex(local_1e8,&local_1f8);
          local_1f8->tet = pppdVar4;
          local_1f8->ver = iVar16;
          unaff_R13 = local_1f8;
        }
        for (lVar13 = 0x18; lVar13 != 0x38; lVar13 = lVar13 + 0x10) {
          pppdVar4 = *(tetrahedron **)((long)&pqueue + lVar13);
          iVar16 = enextesymtbl[*(int *)((long)&local_188.tet + lVar13)];
          arraypool::newindex(local_1e8,&local_1f8);
          local_1f8->tet = pppdVar4;
          local_1f8->ver = iVar16;
          unaff_R13 = local_1f8;
        }
        local_188.ver = eprevtbl[enextesymtbl[local_188.ver]];
        local_178.tet = local_1d0;
        local_178.ver = (int)local_120;
        local_168 = pppdVar11;
        local_160 = local_1e0._0_4_;
        flip32(this,&local_188,1,&fc);
        this_00 = local_1e8;
        local_188.ver = enexttbl[local_188.ver];
        iVar16 = 2;
        while (pppdVar4 = local_188.tet, bVar20 = iVar16 != 0, iVar16 = iVar16 + -1, bVar20) {
          iVar3 = esymtbl[local_188.ver];
          arraypool::newindex(this_00,&local_1f8);
          local_1f8->tet = pppdVar4;
          local_1f8->ver = iVar3;
          local_188.ver = enexttbl[local_188.ver];
          unaff_R13 = local_1f8;
        }
        local_178.ver = enexttbl[local_178.ver];
        iVar16 = 2;
        while (pppdVar4 = local_178.tet, bVar20 = iVar16 != 0, iVar16 = iVar16 + -1, bVar20) {
          iVar3 = esymtbl[local_178.ver];
          arraypool::newindex(this_00,&local_1f8);
          local_1f8->tet = pppdVar4;
          local_1f8->ver = iVar3;
          local_178.ver = enexttbl[local_178.ver];
          unaff_R13 = local_1f8;
        }
        this->flip23count = this->flip23count + -1;
        this->flip32count = this->flip32count + -1;
        this->flip44count = this->flip44count + 1;
        goto LAB_0012c1ad;
      }
LAB_0012c2c4:
      paVar12 = local_1d8;
      arraypool::newindex(local_1d8,&local_1f8);
      local_1f8->tet = pppdVar4;
      local_1f8->ver = (int)local_1f0;
      this_00 = local_1e8;
      unaff_R13 = local_1f8;
      goto LAB_0012baa2;
    }
    flip32(this,&local_188,1,&fc);
    this_00 = local_1e8;
    iVar16 = 3;
    while (pppdVar4 = local_188.tet, bVar20 = iVar16 != 0, iVar16 = iVar16 + -1, bVar20) {
      iVar3 = esymtbl[local_188.ver];
      arraypool::newindex(this_00,&local_1f8);
      local_1f8->tet = pppdVar4;
      local_1f8->ver = iVar3;
      local_188.ver = enexttbl[local_188.ver];
      unaff_R13 = local_1f8;
    }
    iVar16 = 3;
    while (pppdVar4 = local_178.tet, bVar20 = iVar16 != 0, iVar16 = iVar16 + -1, bVar20) {
      iVar3 = esymtbl[local_178.ver];
      arraypool::newindex(this_00,&local_1f8);
      local_1f8->tet = pppdVar4;
      local_1f8->ver = iVar3;
      local_178.ver = enexttbl[local_178.ver];
      unaff_R13 = local_1f8;
    }
  }
LAB_0012c1ad:
  paVar12 = local_1d8;
  for (lVar13 = 0; lVar13 < this_00->objects; lVar13 = lVar13 + 1) {
    unaff_R13 = (triface *)
                (this_00->toparray[(uint)lVar13 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                (long)this_00->objectbytes *
                (long)(int)(this_00->objectsperblockmark & (uint)lVar13));
    flipcertify(this,unaff_R13,&pqueue,plane_pa,local_108,(point)local_1c8);
  }
  this_00->objects = 0;
  lVar13 = paVar12->objects;
  for (lVar15 = 0; lVar15 < lVar13; lVar15 = lVar15 + 1) {
    lVar18 = (long)local_1d8->objectbytes *
             (long)(int)(local_1d8->objectsperblockmark & (uint)lVar15);
    unaff_R13 = (triface *)
                (local_1d8->toparray[(uint)lVar15 >> ((byte)local_1d8->log2objectsperblock & 0x1f)]
                + lVar18);
    lVar18 = *(long *)(local_1d8->toparray
                       [(uint)lVar15 >> ((byte)local_1d8->log2objectsperblock & 0x1f)] + lVar18);
    if ((lVar18 != 0) && (*(long *)(lVar18 + 0x20) != 0)) {
      flipcertify(this,unaff_R13,&pqueue,plane_pa,local_108,(point)local_1c8);
    }
  }
  local_1d8->objects = 0;
  local_128 = (ulong)((int)local_128 + 1);
  paVar12 = local_1d8;
  local_1f8 = unaff_R13;
  goto LAB_0012baa2;
}

Assistant:

void tetgenmesh::flipinsertfacet(arraypool *crosstets, arraypool *toppoints,
                                 arraypool *botpoints, arraypool *midpoints)
{
  arraypool *crossfaces, *bfacearray;
  triface fliptets[6], baktets[2], fliptet, newface;
  triface neightet, *parytet;
  badface *pqueue;
  badface *popbf, bface;
  point plane_pa, plane_pb, plane_pc;
  point p1, p2, pd, pe;
  point *parypt;
  flipconstraints fc;
  REAL ori[3];
  int convcount, copcount;
  int flipflag, fcount;
  int n, i;
  long f23count, f32count, f44count;
  long totalfcount;

  f23count = flip23count;
  f32count = flip32count;
  f44count = flip44count;

  // Get three affinely independent vertices in the missing region R.
  calculateabovepoint(midpoints, &plane_pa, &plane_pb, &plane_pc);

  // Mark top and bottom points. Do not mark midpoints.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest2(*parypt);
    }
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest3(*parypt);
    }
  }

  // Collect crossing faces. 
  crossfaces = cavetetlist;  // Re-use array 'cavetetlist'.

  // Each crossing face contains at least one bottom vertex and
  //   one top vertex.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    fliptet = *parytet;
    for (fliptet.ver = 0; fliptet.ver < 4; fliptet.ver++) {
      fsym(fliptet, neightet);
      if (infected(neightet)) { // It is an interior face.
        if (!marktested(neightet)) { // It is an unprocessed face.
          crossfaces->newindex((void **) &parytet);
          *parytet = fliptet;
        }
      }
    }
    marktest(fliptet);
  }

  if (b->verbose > 1) {
    printf("    Found %ld crossing faces.\n", crossfaces->objects);
  }

  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    unmarktest(*parytet);
    uninfect(*parytet);
  }

  // Initialize the priority queue.
  pqueue = NULL;

  for (i = 0; i < crossfaces->objects; i++) {
    parytet = (triface *) fastlookup(crossfaces, i);
    flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
  }
  crossfaces->restart();

  // The list for temporarily storing unflipable faces.
  bfacearray = new arraypool(sizeof(triface), 4);


  fcount = 0;  // Count the number of flips.

  // Flip insert the facet.
  while (pqueue != NULL) {

    // Pop a face from the priority queue.
    popbf = pqueue;
    bface = *popbf;
    // Update the queue.
    pqueue = pqueue->nextitem;
    // Delete the popped item from the pool.
    flippool->dealloc((void *) popbf);

    if (!isdeadtet(bface.tt)) {
      if ((org(bface.tt) == bface.forg) && (dest(bface.tt) == bface.fdest) &&
          (apex(bface.tt) == bface.fapex) && (oppo(bface.tt) == bface.foppo)) {
        // It is still a crossing face of R.
        fliptet = bface.tt;
        fsym(fliptet, neightet);
        if (oppo(neightet) == bface.noppo) {
          pd = oppo(fliptet);
          pe = oppo(neightet);

          if (b->verbose > 2) {
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                   pointmark(bface.forg), pointmark(bface.fdest),
                   pointmark(bface.fapex), pointmark(bface.foppo),
                   pointmark(bface.noppo), bface.key);
          }
          flipflag = 0;

          // Check for which type of flip can we do.
          convcount = 3;
          copcount = 0;
          for (i = 0; i < 3; i++) {
            p1 = org(fliptet);
            p2 = dest(fliptet);
            ori[i] = orient3d(p1, p2, pd, pe);
            if (ori[i] < 0) {
              convcount--;
              //break;
            } else if (ori[i] == 0) {
              convcount--; // Possible 4-to-4 flip.
              copcount++;
              //break;
            }
            enextself(fliptet);
          }

          if (convcount == 3) {
            // A 2-to-3 flip is found.
            fliptets[0] = fliptet; // abcd, d may be the new vertex.
            fliptets[1] = neightet; // bace.
            flip23(fliptets, 1, &fc);
            // Put the link faces into check list.
            for (i = 0; i < 3; i++) {
              eprevesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            for (i = 0; i < 3; i++) {
              enextesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            flipflag = 1;
          } else if (convcount == 2) {
            //if (copcount <= 1) {
            // A 3-to-2 or 4-to-4 may be possible.
            // Get the edge which is locally non-convex or flat. 
            for (i = 0; i < 3; i++) {
              if (ori[i] <= 0) break;
              enextself(fliptet);
            }

            // Collect tets sharing at this edge.
            esym(fliptet, fliptets[0]); // [b,a,d,c]
            n = 0;
            do {
              p1 = apex(fliptets[n]);
              if (!(pmarktested(p1) || pmarktest2ed(p1) || pmarktest3ed(p1))) {
                // This apex is not on the cavity. Hence the face does not
                //   lie inside the cavity. Do not flip this edge.
                n = 1000; break;
              }
              fnext(fliptets[n], fliptets[n + 1]);
              n++;
            } while ((fliptets[n].tet != fliptet.tet) && (n < 5));

            if (n == 3) {
              // Found a 3-to-2 flip.
              flip32(fliptets, 1, &fc);
              // Put the link faces into check list.
              for (i = 0; i < 3; i++) {
                esym(fliptets[0], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[0]);
              }
              for (i = 0; i < 3; i++) {
                esym(fliptets[1], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[1]);
              }
              flipflag = 1;
            } else if (n == 4) {
              if (copcount == 1) {                
                // Found a 4-to-4 flip. 
                // Let the six vertices are: a,b,c,d,e,f, where
                //   fliptets[0] = [b,a,d,c]
                //           [1] = [b,a,c,e]
                //           [2] = [b,a,e,f]
                //           [3] = [b,a,f,d]
                // After the 4-to-4 flip, edge [a,b] is flipped, edge [e,d]
                //   is created.
                // First do a 2-to-3 flip.
                // Comment: This flip temporarily creates a degenerated
                //   tet (whose volume is zero). It will be removed by the 
                //   followed 3-to-2 flip.
                fliptets[0] = fliptet; // = [a,b,c,d], d is the new vertex.
                // fliptets[1];        // = [b,a,c,e].
                baktets[0] = fliptets[2]; // = [b,a,e,f]
                baktets[1] = fliptets[3]; // = [b,a,f,d]
                // The flip may involve hull tets.
                flip23(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [e,d,a,b] => will be flipped, so 
                //   [a,b,d] and [a,b,e] are not "outer" link faces.
                for (i = 1; i < 3; i++) {
                  eprevesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                for (i = 1; i < 3; i++) {
                  enextesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                // Then do a 3-to-2 flip.
                enextesymself(fliptets[0]);  // fliptets[0] is [e,d,a,b].
                eprevself(fliptets[0]); // = [b,a,d,c], d is the new vertex.
                fliptets[1] = baktets[0]; // = [b,a,e,f]
                fliptets[2] = baktets[1]; // = [b,a,f,d]
                flip32(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [d,e,f,a]
                //   fliptets[1] = [e,d,f,b]
                //   Faces [a,b,d] and [a,b,e] are not "outer" link faces.
                enextself(fliptets[0]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[0], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[0]);
                }
                enextself(fliptets[1]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[1], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[1]);
                }
                flip23count--;
                flip32count--;
                flip44count++;
                flipflag = 1;
              }
            }
          } else {
            // There are more than 1 non-convex or coplanar cases.
            flipflag = -1; // Ignore this face.
            if (b->verbose > 2) {
              printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                     pointmark(bface.forg), pointmark(bface.fdest),
                     pointmark(bface.fapex), pointmark(bface.foppo),
                     pointmark(bface.noppo), bface.key);
            }
          } // if (convcount == 1)

          if (flipflag == 1) {
            // Update the priority queue.
            for (i = 0; i < crossfaces->objects; i++) {
              parytet = (triface *) fastlookup(crossfaces, i);
              flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
            }
            crossfaces->restart();
            if (1) { // if (!b->flipinsert_random) {
              // Insert all queued unflipped faces.
              for (i = 0; i < bfacearray->objects; i++) {
                parytet = (triface *) fastlookup(bfacearray, i);
                // This face may be changed.
                if (!isdeadtet(*parytet)) {
                  flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
                }
              }
              bfacearray->restart();
            }
            fcount++;
          } else if (flipflag == 0) {
            // Queue an unflippable face. To process it later.
            bfacearray->newindex((void **) &parytet);
            *parytet = fliptet;
          }
        } // if (pe == bface.noppo)  
      } // if ((pa == bface.forg) && ...)
    } // if (bface.tt != NULL)

  } // while (pqueue != NULL)

  if (bfacearray->objects > 0) {
    if (fcount == 0) {
      printf("!! No flip is found in %ld faces.\n", bfacearray->objects);
      terminatetetgen(this, 2); //assert(0);
    }
  }

  delete bfacearray;

  // Un-mark top and bottom points.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    punmarktest2(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    punmarktest3(*parypt);
  }

  f23count = flip23count - f23count;
  f32count = flip32count - f32count;
  f44count = flip44count - f44count;
  totalfcount = f23count + f32count + f44count;
  if (b->verbose > 2) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           totalfcount, f23count, f32count, f44count);
  }
}